

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void V_RefreshViewBorder(void)

{
  FTexture *pFVar1;
  uint uVar2;
  int iVar3;
  
  if (setblocks < 10) {
    if (BorderNeedRefresh == 0) {
      if (BorderTopRefresh != 0) {
        BorderTopRefresh = BorderTopRefresh + -1;
        iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        if (viewwidth != iVar3) {
          if (viewwindowy < 0x22) {
            uVar2 = (uint)gameinfo.Border.offset;
            V_DrawBorder(0,0,viewwindowx,0x22);
            V_DrawBorder(viewwindowx,0,viewwidth + viewwindowx,viewwindowy);
            V_DrawBorder(viewwidth + viewwindowx,0,(screen->super_DSimpleCanvas).super_DCanvas.Width
                         ,0x22);
            pFVar1 = FTextureManager::operator()(&TexMan,gameinfo.Border.t.Chars);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                      (screen,(ulong)(uint)viewwindowx,(ulong)(viewwindowy - (uint)pFVar1->Height),
                       (ulong)(uint)(viewwidth + viewwindowx),(ulong)(uint)viewwindowy,pFVar1,1);
            pFVar1 = FTextureManager::operator()(&TexMan,gameinfo.Border.l.Chars);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                      (screen,(ulong)(viewwindowx - (uint)pFVar1->Width),(ulong)(uint)viewwindowy,
                       (ulong)(uint)viewwindowx,0x23,pFVar1,1);
            pFVar1 = FTextureManager::operator()(&TexMan,gameinfo.Border.r.Chars);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                      (screen,(ulong)(uint)(viewwidth + viewwindowx),(ulong)(uint)viewwindowy,
                       (ulong)((uint)pFVar1->Width + viewwidth + viewwindowx),0x23,pFVar1,1);
            pFVar1 = FTextureManager::operator()(&TexMan,gameinfo.Border.tl.Chars);
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFVar1,(double)(int)(viewwindowx - uVar2),
                       (double)(int)(viewwindowy - uVar2),0);
            pFVar1 = FTextureManager::operator()(&TexMan,gameinfo.Border.tr.Chars);
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFVar1,(double)(viewwidth + viewwindowx),
                       (double)(int)(viewwindowy - uVar2),0);
            return;
          }
          V_DrawBorder(0,0,iVar3,0x22);
          return;
        }
      }
    }
    else {
      BorderNeedRefresh = BorderNeedRefresh + -1;
      if (BorderTopRefresh != 0) {
        BorderTopRefresh = BorderTopRefresh + -1;
      }
      iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      if (0x140 < iVar3) {
        ST_SetNeedRefresh();
        iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      }
      if (viewwidth != iVar3) {
        V_DrawBorder(0,0,iVar3,viewwindowy);
        V_DrawBorder(0,viewwindowy,viewwindowx,viewheight + viewwindowy);
        V_DrawBorder(viewwidth + viewwindowx,viewwindowy,
                     (screen->super_DSimpleCanvas).super_DCanvas.Width,viewheight + viewwindowy);
        V_DrawBorder(0,viewheight + viewwindowy,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                     ST_Y);
        V_DrawFrame(viewwindowx,viewwindowy,viewwidth,viewheight);
        V_MarkRect(0,0,(screen->super_DSimpleCanvas).super_DCanvas.Width,ST_Y);
        return;
      }
    }
  }
  return;
}

Assistant:

void V_RefreshViewBorder ()
{
	if (setblocks < 10)
	{
		if (BorderNeedRefresh)
		{
			BorderNeedRefresh--;
			if (BorderTopRefresh)
			{
				BorderTopRefresh--;
			}
			V_DrawViewBorder();
		}
		else if (BorderTopRefresh)
		{
			BorderTopRefresh--;
			V_DrawTopBorder();
		}
	}
}